

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

size_t __thiscall RenX::Server::getBotCount(Server *this)

{
  size_t sVar1;
  _List_node_base *p_Var2;
  
  sVar1 = 0;
  for (p_Var2 = (this->players).
                super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->players;
      p_Var2 = p_Var2->_M_next) {
    sVar1 = sVar1 + *(byte *)&p_Var2[0x11]._M_next;
  }
  return sVar1;
}

Assistant:

size_t RenX::Server::getBotCount() const {
	size_t count = 0;

	for (auto node = this->players.begin(); node != this->players.end(); ++node) {
		if (node->isBot) {
			++count;
		}
	}

	return count;
	//return RenX::Server::bot_count;
}